

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O2

void test_bson_append_int32(void)

{
  char cVar1;
  bson_t *a;
  bson_t *b;
  undefined8 uVar2;
  char *pcVar3;
  
  a = (bson_t *)bson_new();
  cVar1 = bson_append_int32(a,"a",0xffffffffffffffff,0xffffffffffffff85);
  if (cVar1 == '\0') {
    pcVar3 = "bson_append_int32 (b, \"a\", -1, -123)";
    uVar2 = 0x22e;
  }
  else {
    cVar1 = bson_append_int32(a,"c",0xffffffffffffffff,0);
    if (cVar1 == '\0') {
      pcVar3 = "bson_append_int32 (b, \"c\", -1, 0)";
      uVar2 = 0x22f;
    }
    else {
      cVar1 = bson_append_int32(a,"b",0xffffffffffffffff,0x7b);
      if (cVar1 != '\0') {
        b = get_bson("test33.bson");
        BSON_ASSERT_BSON_EQUAL(a,b);
        bson_destroy(a);
        bson_destroy(b);
        return;
      }
      pcVar3 = "bson_append_int32 (b, \"b\", -1, 123)";
      uVar2 = 0x230;
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
          uVar2,"test_bson_append_int32",pcVar3);
  abort();
}

Assistant:

static void
test_bson_append_int32 (void)
{
   bson_t *b;
   bson_t *b2;

   b = bson_new ();
   BSON_ASSERT (bson_append_int32 (b, "a", -1, -123));
   BSON_ASSERT (bson_append_int32 (b, "c", -1, 0));
   BSON_ASSERT (bson_append_int32 (b, "b", -1, 123));
   b2 = get_bson ("test33.bson");
   BSON_ASSERT_BSON_EQUAL (b, b2);
   bson_destroy (b);
   bson_destroy (b2);
}